

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

QPDFObjGen __thiscall QPDFWriter::getRenumberedObjGen(QPDFWriter *this,QPDFObjGen og)

{
  Object *pOVar1;
  QPDFObjGen QVar2;
  
  pOVar1 = ObjTable<QPDFWriter::Object>::operator[]
                     (&(((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->obj).super_ObjTable<QPDFWriter::Object>,og);
  QVar2.gen = 0;
  QVar2.obj = pOVar1->renumber;
  return QVar2;
}

Assistant:

QPDFObjGen
QPDFWriter::getRenumberedObjGen(QPDFObjGen og)
{
    return QPDFObjGen(m->obj[og].renumber, 0);
}